

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_job_queue_post(ma_job_queue *pQueue,ma_job *pJob)

{
  ulong expected;
  ma_bool32 mVar1;
  ma_uint64 next;
  ma_uint64 tail;
  ma_uint64 slot;
  ma_job *pmStack_98;
  ma_result result;
  ma_job *pJob_local;
  ma_job_queue *pQueue_local;
  ma_uint64 local_80;
  ulong local_78;
  ma_uint64 local_70;
  ulong local_68;
  ma_uint64 local_60;
  ma_uint64 local_58;
  ma_uint64 local_50;
  ma_uint64 local_48;
  ma_uint64 local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  if ((pQueue == (ma_job_queue *)0x0) || (pJob == (ma_job *)0x0)) {
    pQueue_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    pmStack_98 = pJob;
    pJob_local = (ma_job *)pQueue;
    slot._4_4_ = ma_slot_allocator_alloc(&pQueue->allocator,&tail);
    pQueue_local._4_4_ = slot._4_4_;
    if (slot._4_4_ == MA_SUCCESS) {
      local_40 = tail;
      if ((pJob_local->toc).breakup.refcount <= (uint)(ushort)tail) {
        __assert_fail("ma_job_extract_slot(slot) < pQueue->capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x16fe,"ma_result ma_job_queue_post(ma_job_queue *, const ma_job *)");
      }
      local_48 = tail;
      memcpy((void *)(*(long *)((long)&pJob_local[1].data + 0x20) + (tail & 0xffff) * 0x68),
             pmStack_98,0x68);
      local_50 = tail;
      *(ma_uint64 *)(*(long *)((long)&pJob_local[1].data + 0x20) + (tail & 0xffff) * 0x68) = tail;
      local_58 = tail;
      *(ma_uint16 *)(*(long *)((long)&pJob_local[1].data + 0x20) + (tail & 0xffff) * 0x68) =
           (pmStack_98->toc).breakup.code;
      local_60 = tail;
      *(undefined8 *)(*(long *)((long)&pJob_local[1].data + 0x20) + (tail & 0xffff) * 0x68 + 8) =
           0xffffffffffffffff;
      ma_spinlock_lock((ma_spinlock *)((long)&pJob_local[1].data + 0x28));
      do {
        while( true ) {
          do {
            expected = *(ulong *)&pJob_local->order;
            local_70 = *(ma_uint64 *)
                        (*(long *)((long)&pJob_local[1].data + 0x20) + 8 +
                        (expected & 0xffff) * 0x68);
            local_38 = *(ulong *)&pJob_local->order;
          } while ((expected & 0xffffffff0000ffff) != (local_38 & 0xffffffff0000ffff));
          local_68 = expected;
          local_30 = local_38;
          local_28 = expected;
          local_20 = expected;
          local_18 = expected;
          local_10 = local_38;
          if ((short)local_70 == -1) break;
          local_80 = local_70;
          ma_job_queue_cas((ma_uint64 *)&pJob_local->order,expected,local_70 & 0xffff);
        }
        local_78 = expected;
        mVar1 = ma_job_queue_cas((ma_uint64 *)
                                 (*(long *)((long)&pJob_local[1].data + 0x20) +
                                  (expected & 0xffff) * 0x68 + 8),local_70,tail);
      } while (mVar1 == 0);
      ma_job_queue_cas((ma_uint64 *)&pJob_local->order,expected,tail);
      ma_spinlock_unlock((ma_spinlock *)((long)&pJob_local[1].data + 0x28));
      if (((ulong)pJob_local->toc & 1) == 0) {
        ma_semaphore_release((ma_semaphore *)&(pJob_local->data).custom);
      }
      pQueue_local._4_4_ = MA_SUCCESS;
    }
  }
  return pQueue_local._4_4_;
}

Assistant:

MA_API ma_result ma_job_queue_post(ma_job_queue* pQueue, const ma_job* pJob)
{
    /*
    Lock free queue implementation based on the paper by Michael and Scott: Nonblocking Algorithms and Preemption-Safe Locking on Multiprogrammed Shared Memory Multiprocessors
    */
    ma_result result;
    ma_uint64 slot;
    ma_uint64 tail;
    ma_uint64 next;

    if (pQueue == NULL || pJob == NULL) {
        return MA_INVALID_ARGS;
    }

    /* We need a new slot. */
    result = ma_slot_allocator_alloc(&pQueue->allocator, &slot);
    if (result != MA_SUCCESS) {
        return result;  /* Probably ran out of slots. If so, MA_OUT_OF_MEMORY will be returned. */
    }

    /* At this point we should have a slot to place the job. */
    MA_ASSERT(ma_job_extract_slot(slot) < pQueue->capacity);

    /* We need to put the job into memory before we do anything. */
    pQueue->pJobs[ma_job_extract_slot(slot)]                  = *pJob;
    pQueue->pJobs[ma_job_extract_slot(slot)].toc.allocation   = slot;                    /* This will overwrite the job code. */
    pQueue->pJobs[ma_job_extract_slot(slot)].toc.breakup.code = pJob->toc.breakup.code;  /* The job code needs to be applied again because the line above overwrote it. */
    pQueue->pJobs[ma_job_extract_slot(slot)].next             = MA_JOB_ID_NONE;          /* Reset for safety. */

    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_lock(&pQueue->lock);
    #endif
    {
        /* The job is stored in memory so now we need to add it to our linked list. We only ever add items to the end of the list. */
        for (;;) {
            tail = c89atomic_load_64(&pQueue->tail);
            next = c89atomic_load_64(&pQueue->pJobs[ma_job_extract_slot(tail)].next);

            if (ma_job_toc_to_allocation(tail) == ma_job_toc_to_allocation(c89atomic_load_64(&pQueue->tail))) {
                if (ma_job_extract_slot(next) == 0xFFFF) {
                    if (ma_job_queue_cas(&pQueue->pJobs[ma_job_extract_slot(tail)].next, next, slot)) {
                        break;
                    }
                } else {
                    ma_job_queue_cas(&pQueue->tail, tail, ma_job_extract_slot(next));
                }
            }
        }
        ma_job_queue_cas(&pQueue->tail, tail, slot);
    }
    #ifndef MA_USE_EXPERIMENTAL_LOCK_FREE_JOB_QUEUE
    ma_spinlock_unlock(&pQueue->lock);
    #endif


    /* Signal the semaphore as the last step if we're using synchronous mode. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_release(&pQueue->sem);
        }
        #else
        {
            MA_ASSERT(MA_FALSE);    /* Should never get here. Should have been checked at initialization time. */
        }
        #endif
    }

    return MA_SUCCESS;
}